

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_param(Net *this,uchar *_mem)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Layer *__new_size;
  uint *puVar4;
  reference pvVar5;
  reference ppLVar6;
  int *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int lr;
  int pdlr;
  Blob *blob_1;
  int top_blob_index;
  int j_1;
  Blob *blob;
  int bottom_blob_index;
  int j;
  int custom_index;
  Layer *layer;
  int top_count;
  int bottom_count;
  int typeindex;
  int i;
  ParamDict pd;
  int blob_count;
  int layer_count;
  int magic;
  uchar *mem;
  int in_stack_fffffffffffff9b4;
  uint in_stack_fffffffffffff9b8;
  uint in_stack_fffffffffffff9bc;
  uint uVar7;
  Layer *in_stack_fffffffffffff9c0;
  size_type in_stack_fffffffffffff9c8;
  int local_614;
  Net *in_stack_fffffffffffff9f0;
  int local_600;
  Layer *local_5e8;
  int local_5d4;
  undefined1 local_5d0 [1444];
  int local_2c;
  int local_28;
  int local_24;
  uint *local_20;
  int *local_18;
  int local_4;
  
  if (((ulong)in_RSI & 3) == 0) {
    local_24 = *in_RSI;
    local_20 = (uint *)(in_RSI + 1);
    if (local_24 == 0x7685dd) {
      local_28 = *local_20;
      local_2c = in_RSI[2];
      local_20 = (uint *)(in_RSI + 3);
      local_18 = in_RSI;
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)in_RDI,
                 in_stack_fffffffffffff9c8);
      std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)in_RDI,in_stack_fffffffffffff9c8
                );
      ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff9f0);
      for (local_5d4 = 0; local_5d4 < local_28; local_5d4 = local_5d4 + 1) {
        uVar7 = *local_20;
        uVar1 = local_20[1];
        uVar2 = local_20[2];
        local_20 = local_20 + 3;
        __new_size = create_layer(in_stack_fffffffffffff9bc);
        local_5e8 = __new_size;
        if (__new_size == (Layer *)0x0) {
          in_stack_fffffffffffff9c0 =
               create_custom_layer((Net *)CONCAT44(in_stack_fffffffffffff9bc,
                                                   in_stack_fffffffffffff9b8),
                                   in_stack_fffffffffffff9b4);
          local_5e8 = in_stack_fffffffffffff9c0;
        }
        if (local_5e8 == (Layer *)0x0) {
          fprintf(_stderr,"layer %d not exists or registered\n",(ulong)uVar7);
          clear(in_stack_fffffffffffff9f0);
          local_4 = -1;
          goto LAB_00136dc2;
        }
        std::vector<int,_std::allocator<int>_>::resize(in_RDI,(size_type)__new_size);
        for (local_600 = 0; local_600 < (int)uVar1; local_600 = local_600 + 1) {
          uVar7 = *local_20;
          local_20 = local_20 + 1;
          in_stack_fffffffffffff9f0 =
               (Net *)std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                 &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(long)(int)uVar7);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9c0,
                     (value_type_conflict1 *)
                     CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
          puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_5e8->bottoms,(long)local_600);
          *puVar4 = uVar7;
          in_stack_fffffffffffff9bc = uVar7;
        }
        std::vector<int,_std::allocator<int>_>::resize(in_RDI,(size_type)__new_size);
        for (local_614 = 0; local_614 < (int)uVar2; local_614 = local_614 + 1) {
          in_stack_fffffffffffff9b8 = *local_20;
          local_20 = local_20 + 1;
          pvVar5 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                             ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                              &(((_Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                &in_RDI->super__Vector_base<int,_std::allocator<int>_>)->_M_impl).
                               super__Vector_impl_data._M_end_of_storage,
                              (long)(int)in_stack_fffffffffffff9b8);
          pvVar5->producer = local_5d4;
          puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_5e8->tops,(long)local_614);
          *puVar4 = in_stack_fffffffffffff9b8;
        }
        in_stack_fffffffffffff9b4 =
             ParamDict::load_param
                       ((ParamDict *)in_stack_fffffffffffff9c0,
                        (uchar **)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
        if (in_stack_fffffffffffff9b4 == 0) {
          iVar3 = (*local_5e8->_vptr_Layer[2])(local_5e8,local_5d0);
          if (iVar3 == 0) {
            ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                 &(((_Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                   &in_RDI[1].super__Vector_base<int,_std::allocator<int>_>)->
                                  _M_impl).super__Vector_impl_data._M_end_of_storage,(long)local_5d4
                                );
            *ppLVar6 = local_5e8;
          }
          else {
            fprintf(_stderr,"layer load_param failed\n");
          }
        }
        else {
          fprintf(_stderr,"ParamDict load_param failed\n");
        }
      }
      local_4 = (int)local_20 - (int)local_18;
LAB_00136dc2:
      ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffff9c0);
    }
    else {
      fprintf(_stderr,"param is too old, please regenerate\n");
      local_4 = -1;
    }
  }
  else {
    fprintf(_stderr,"memory not 32-bit aligned at %p\n",in_RSI);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int Net::load_param(const unsigned char* _mem)
{
    if ((unsigned long)_mem & 0x3)
    {
        // reject unaligned memory
        fprintf(stderr, "memory not 32-bit aligned at %p\n", _mem);
        return -1;
    }

    const unsigned char* mem = _mem;

    int magic = *(int*)(mem);
    mem += 4;

    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    int layer_count = *(int*)(mem);
    mem += 4;

    int blob_count = *(int*)(mem);
    mem += 4;

    layers.resize(layer_count);
    blobs.resize(blob_count);

#if NCNN_VULKAN
    if (use_vulkan_compute && !vkdev)
    {
        // use default vulkan device
        if (!vkdev_local)
            vkdev_local = new VulkanDevice;
        vkdev = vkdev_local;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i=0; i<layer_count; i++)
    {
        int typeindex = *(int*)mem;
        mem += 4;

        int bottom_count = *(int*)mem;
        mem += 4;

        int top_count = *(int*)mem;
        mem += 4;

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %d not exists or registered\n", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

//         layer->type = std::string(layer_type);
//         layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d\n", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            int bottom_blob_index = *(int*)mem;
            mem += 4;

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            int top_blob_index = *(int*)mem;
            mem += 4;

            Blob& blob = blobs[top_blob_index];

//             blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param(mem);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

    return mem - _mem;
}